

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O2

void __thiscall
irr::video::CImage::CImage
          (CImage *this,ECOLOR_FORMAT format,dimension2d<unsigned_int> *size,void *data,
          bool ownForeignMemory,bool deleteMemory)

{
  u32 uVar1;
  u8 *__dest;
  undefined7 in_register_00000081;
  
  *(undefined ***)&(this->super_IImage).field_0x38 = &PTR__IReferenceCounted_0027ba48;
  *(undefined8 *)&(this->super_IImage).field_0x40 = 0;
  *(undefined4 *)&(this->super_IImage).field_0x48 = 1;
  IImage::IImage(&this->super_IImage,&PTR_construction_vtable_24__00285ed8,format,size,deleteMemory)
  ;
  (this->super_IImage)._vptr_IImage = (_func_int **)0x285e48;
  *(undefined8 *)&(this->super_IImage).field_0x38 = 0x285ec0;
  if ((int)CONCAT71(in_register_00000081,ownForeignMemory) == 0) {
    uVar1 = IImage::getDataSizeFromFormat
                      ((this->super_IImage).Format,(this->super_IImage).Size.Width,
                       (this->super_IImage).Size.Height);
    __dest = (u8 *)operator_new__((ulong)(uVar1 + 0xf & 0xfffffff0));
    (this->super_IImage).Data = __dest;
    memcpy(__dest,data,(ulong)uVar1);
    (this->super_IImage).DeleteMemory = true;
  }
  else {
    (this->super_IImage).Data = (u8 *)data;
  }
  return;
}

Assistant:

CImage::CImage(ECOLOR_FORMAT format, const core::dimension2d<u32> &size, void *data,
		bool ownForeignMemory, bool deleteMemory) :
		IImage(format, size, deleteMemory)
{
	if (ownForeignMemory) {
		Data = (u8 *)data;
	} else {
		const u32 dataSize = getDataSizeFromFormat(Format, Size.Width, Size.Height);
		const u32 allocSize = align_next(dataSize, 16);

		// allocate as u32 to ensure enough alignment when casted
		Data = reinterpret_cast<u8 *>(new u32[allocSize / 4]);
		memcpy(Data, data, dataSize);
		DeleteMemory = true;
	}
}